

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

void mi_segment_commit_mask
               (mi_segment_t *segment,_Bool conservative,uint8_t *p,size_t size,uint8_t **start_p,
               size_t *full_size,mi_commit_mask_t *cm)

{
  mi_commit_mask_t *pmVar1;
  mi_commit_mask_t *bitidx_00;
  mi_commit_mask_t *sz;
  mi_commit_mask_t *cm_00;
  ulong in_RCX;
  ulong in_RDX;
  byte in_SIL;
  mi_segment_t *in_RDI;
  long *in_R8;
  ulong *in_R9;
  mi_commit_mask_t *in_stack_00000008;
  size_t bitcount;
  size_t bitidx;
  size_t end;
  size_t start;
  size_t pstart;
  size_t segsize;
  size_t segstart;
  ulong local_70;
  mi_commit_mask_t *local_58;
  
  mi_commit_mask_create_empty(in_stack_00000008);
  if (((in_RCX != 0) && (in_RCX < 0x2000001)) && (in_RDI->kind != MI_SEGMENT_HUGE)) {
    pmVar1 = (mi_commit_mask_t *)mi_segment_info_size(in_RDI);
    bitidx_00 = (mi_commit_mask_t *)mi_segment_size(in_RDI);
    if (in_RDX < (ulong)((long)bitidx_00->mask + (long)(&in_RDI->purge_mask + -1) + 8)) {
      sz = (mi_commit_mask_t *)(in_RDX - (long)in_RDI);
      if ((in_SIL & 1) == 0) {
        cm_00 = (mi_commit_mask_t *)_mi_align_down((uintptr_t)sz,0x10000);
        local_58 = (mi_commit_mask_t *)_mi_align_up((long)sz->mask + in_RCX,0x10000);
      }
      else {
        cm_00 = (mi_commit_mask_t *)_mi_align_up((uintptr_t)sz,0x10000);
        local_58 = (mi_commit_mask_t *)_mi_align_down((long)sz->mask + in_RCX,0x10000);
      }
      if ((pmVar1 <= sz) && (cm_00 < pmVar1)) {
        cm_00 = pmVar1;
      }
      if (bitidx_00 < local_58) {
        local_58 = bitidx_00;
      }
      *in_R8 = (long)cm_00->mask + (long)(&in_RDI->purge_mask + -1) + 8;
      if (cm_00 < local_58) {
        local_70 = (long)local_58 - (long)cm_00;
      }
      else {
        local_70 = 0;
      }
      *in_R9 = local_70;
      if (*in_R9 != 0) {
        if (0x200 < ((ulong)cm_00 >> 0x10) + (*in_R9 >> 0x10)) {
          _mi_warning_message("commit mask overflow: idx=%zu count=%zu start=%zx end=%zx p=0x%p size=%zu fullsize=%zu\n"
                              ,(ulong)cm_00 >> 0x10,*in_R9 >> 0x10,cm_00,local_58,in_RDX,in_RCX,
                              *in_R9);
        }
        mi_commit_mask_create((size_t)bitidx_00,(size_t)sz,cm_00);
      }
    }
  }
  return;
}

Assistant:

static void mi_segment_commit_mask(mi_segment_t* segment, bool conservative, uint8_t* p, size_t size, uint8_t** start_p, size_t* full_size, mi_commit_mask_t* cm) {
  mi_assert_internal(_mi_ptr_segment(p + 1) == segment);
  mi_assert_internal(segment->kind != MI_SEGMENT_HUGE);
  mi_commit_mask_create_empty(cm);
  if (size == 0 || size > MI_SEGMENT_SIZE || segment->kind == MI_SEGMENT_HUGE) return;
  const size_t segstart = mi_segment_info_size(segment);
  const size_t segsize = mi_segment_size(segment);
  if (p >= (uint8_t*)segment + segsize) return;

  size_t pstart = (p - (uint8_t*)segment);
  mi_assert_internal(pstart + size <= segsize);

  size_t start;
  size_t end;
  if (conservative) {
    // decommit conservative
    start = _mi_align_up(pstart, MI_COMMIT_SIZE);
    end   = _mi_align_down(pstart + size, MI_COMMIT_SIZE);
    mi_assert_internal(start >= segstart);
    mi_assert_internal(end <= segsize);
  }
  else {
    // commit liberal
    start = _mi_align_down(pstart, MI_MINIMAL_COMMIT_SIZE);
    end   = _mi_align_up(pstart + size, MI_MINIMAL_COMMIT_SIZE);
  }
  if (pstart >= segstart && start < segstart) {  // note: the mask is also calculated for an initial commit of the info area
    start = segstart;
  }
  if (end > segsize) {
    end = segsize;
  }

  mi_assert_internal(start <= pstart && (pstart + size) <= end);
  mi_assert_internal(start % MI_COMMIT_SIZE==0 && end % MI_COMMIT_SIZE == 0);
  *start_p   = (uint8_t*)segment + start;
  *full_size = (end > start ? end - start : 0);
  if (*full_size == 0) return;

  size_t bitidx = start / MI_COMMIT_SIZE;
  mi_assert_internal(bitidx < MI_COMMIT_MASK_BITS);

  size_t bitcount = *full_size / MI_COMMIT_SIZE; // can be 0
  if (bitidx + bitcount > MI_COMMIT_MASK_BITS) {
    _mi_warning_message("commit mask overflow: idx=%zu count=%zu start=%zx end=%zx p=0x%p size=%zu fullsize=%zu\n", bitidx, bitcount, start, end, p, size, *full_size);
  }
  mi_assert_internal((bitidx + bitcount) <= MI_COMMIT_MASK_BITS);
  mi_commit_mask_create(bitidx, bitcount, cm);
}